

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_
          (string *__return_storage_ptr__,UnitTestImpl *this,int skip_count)

{
  long lVar1;
  OsStackTraceGetterInterface *pOVar2;
  undefined **ppuVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pOVar2 = this->os_stack_trace_getter_;
  if (pOVar2 == (OsStackTraceGetterInterface *)0x0) {
    pOVar2 = (OsStackTraceGetterInterface *)operator_new(8);
    ppuVar3 = &PTR__OsStackTraceGetterInterface_001886a0;
    pOVar2->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_001886a0;
    this->os_stack_trace_getter_ = pOVar2;
  }
  else {
    ppuVar3 = pOVar2->_vptr_OsStackTraceGetterInterface;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (*((_func_int **)ppuVar3)[2])
              (__return_storage_ptr__,pOVar2,(ulong)FLAGS_gtest_stack_trace_depth,
               (ulong)(skip_count + 1));
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string UnitTestImpl::CurrentOsStackTraceExceptTop(int skip_count) {
  return os_stack_trace_getter()->CurrentStackTrace(
      static_cast<int>(GTEST_FLAG(stack_trace_depth)),
      skip_count + 1
      // Skips the user-specified number of frames plus this function
      // itself.
      );  // NOLINT
}